

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void __thiscall
flatbuffers::JsonPrinter::GenField<unsigned_char>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  uchar defaultval;
  _Storage<unsigned_char,_true> val;
  Optional<unsigned_char> OVar1;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,fixed) == 0) {
    if (fd->presence == kOptional) {
      OVar1 = Table::GetOptional<unsigned_char,unsigned_char>(table,(fd->value).offset);
      if (((ushort)OVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_char> >> 8 & 1) == 0) {
        std::__cxx11::string::append((char *)this->text);
        return;
      }
      val._M_value = OVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_char>._M_payload;
    }
    else {
      field = (fd->value).offset;
      defaultval = GetFieldDefault<unsigned_char>(fd);
      val._M_value = Table::GetField<unsigned_char>(table,field,defaultval);
    }
  }
  else {
    val = (_Storage<unsigned_char,_true>)
          ((_Storage<unsigned_char,_true> *)(table + (fd->value).offset))->_M_value;
  }
  PrintScalar<unsigned_char>(this,val._M_value,&(fd->value).type,indent);
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }